

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_analyzer.cc
# Opt level: O1

void __thiscall AnalyzerDecl::GenInitCode(AnalyzerDecl *this,Output *out_cc)

{
  pointer ppAVar1;
  
  TypeDecl::GenInitCode(&this->super_TypeDecl,out_cc);
  if (this->constructor_helpers_ != (AnalyzerHelperList *)0x0) {
    for (ppAVar1 = (this->constructor_helpers_->
                   super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar1 !=
        (this->constructor_helpers_->
        super__Vector_base<AnalyzerHelper_*,_std::allocator<AnalyzerHelper_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppAVar1 = ppAVar1 + 1) {
      AnalyzerHelper::GenCode(*ppAVar1,(Output *)0x0,out_cc,this);
    }
  }
  return;
}

Assistant:

void AnalyzerDecl::GenInitCode(Output* out_cc)
	{
	TypeDecl::GenInitCode(out_cc);
	foreach (i, AnalyzerHelperList, constructor_helpers_)
		{
		(*i)->GenCode(nullptr, out_cc, this);
		}
	}